

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  proxy_info *ppVar10;
  proxy_info *ppVar11;
  CURLcode CVar12;
  byte *__s;
  byte *__s_00;
  bool bVar13;
  char *proxypasswd;
  char *proxyuser;
  char *endp;
  char *local_70;
  char *local_68;
  connectdata *local_60;
  CURLcode local_54;
  Curl_easy *local_50;
  proxy_info *local_48;
  ulong local_40;
  char *local_38;
  
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  pcVar7 = strstr(proxy,"://");
  __s = (byte *)proxy;
  if (pcVar7 != (char *)0x0) {
    __s = (byte *)(pcVar7 + 3);
    iVar6 = curl_strnequal("https",proxy,5);
    if (iVar6 == 0) {
      iVar6 = curl_strnequal("socks5h",proxy,7);
      if (iVar6 == 0) {
        iVar6 = curl_strnequal("socks5",proxy,6);
        if (iVar6 == 0) {
          iVar6 = curl_strnequal("socks4a",proxy,7);
          if (iVar6 == 0) {
            iVar6 = curl_strnequal("socks4",proxy,6);
            if ((iVar6 == 0) && (iVar6 = curl_strnequal("socks",proxy,5), iVar6 == 0)) {
              iVar6 = curl_strnequal("http:",proxy,5);
              if (iVar6 == 0) {
                Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
                return CURLE_COULDNT_CONNECT;
              }
            }
            else {
              proxytype = CURLPROXY_SOCKS4;
            }
          }
          else {
            proxytype = CURLPROXY_SOCKS4A;
          }
        }
        else {
          proxytype = CURLPROXY_SOCKS5;
        }
      }
      else {
        proxytype = CURLPROXY_SOCKS5_HOSTNAME;
      }
    }
    else {
      proxytype = CURLPROXY_HTTPS;
    }
  }
  if ((proxytype == CURLPROXY_HTTPS) && ((Curl_ssl->supports & 0x10) == 0)) {
    Curl_failf(data,"Unsupported proxy \'%s\', libcurl is built without the HTTPS-proxy support.",
               proxy);
    return CURLE_NOT_BUILT_IN;
  }
  pcVar7 = strchr((char *)__s,0x40);
  if (pcVar7 != (char *)0x0) {
    local_54 = Curl_parse_login_details
                         ((char *)__s,(long)pcVar7 - (long)__s,&local_68,&local_70,(char **)0x0);
    __s = (byte *)(pcVar7 + 1);
    if (local_54 != CURLE_OK) {
      return local_54;
    }
  }
  __s_00 = __s;
  if (*__s == 0x5b) {
    bVar2 = __s[1];
    __s_00 = __s + 1;
    for (__s = __s_00;
        (bVar2 != 0 &&
        (((iVar6 = Curl_isxdigit((uint)bVar2), iVar6 != 0 || (*__s == 0x3a)) || (*__s == 0x2e))));
        __s = __s + 1) {
      bVar2 = __s[1];
    }
    if (*__s == 0x25) {
      iVar6 = strncmp("%25",(char *)__s,3);
      if (iVar6 != 0) {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      do {
        pbVar1 = __s + 1;
        __s = __s + 1;
        if (*pbVar1 == 0) break;
        iVar6 = Curl_isalpha((uint)*pbVar1);
      } while (((iVar6 != 0) || (iVar6 = Curl_isxdigit((uint)*__s), iVar6 != 0)) ||
              ((bVar2 = *__s, bVar2 - 0x2d < 2 || ((bVar2 == 0x7e || (bVar2 == 0x5f))))));
    }
    if (*__s == 0x5d) {
      *__s = 0;
      __s = __s + 1;
    }
    else {
      Curl_infof(data,"Invalid IPv6 address format\n");
    }
  }
  pcVar7 = strchr((char *)__s,0x3a);
  if (pcVar7 == (char *)0x0) {
    if (*__s_00 == 0x2f) {
      (*Curl_cfree)(local_68);
      local_68 = (char *)0x0;
      (*Curl_cfree)(local_70);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    pcVar7 = strchr((char *)__s_00,0x2f);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    uVar8 = 0x438;
    if (proxytype == CURLPROXY_HTTPS) {
      uVar8 = 0x1bb;
    }
    uVar4 = (data->set).proxyport;
    if (uVar4 != 0) {
      uVar8 = uVar4;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar7 = '\0';
    uVar8 = strtol(pcVar7 + 1,&local_38,10);
    if (((((local_38 == (char *)0x0) || (cVar3 = *local_38, cVar3 == '\0')) || (cVar3 == '/')) ||
        (cVar3 == ' ')) && (uVar8 < 0x10000)) {
      conn->port = uVar8;
    }
    else {
      Curl_infof(data,"No valid port number in proxy string (%s)\n",pcVar7 + 1);
    }
  }
  CVar5 = local_54;
  if (*__s_00 == 0) goto LAB_00444db3;
  ppVar10 = &conn->socks_proxy;
  ppVar11 = &conn->http_proxy;
  if ((proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4) {
    ppVar11 = ppVar10;
  }
  ppVar11->proxytype = proxytype;
  local_60 = conn;
  local_50 = data;
  if (local_68 == (char *)0x0) {
LAB_00444d2f:
    if ((-1 < (long)uVar8) &&
       (((ppVar11->port = uVar8,
         (proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4 ||
         (local_60->port < 0)) || ((ppVar10->host).rawalloc == (char *)0x0)))) {
      local_60->port = uVar8;
    }
    (*Curl_cfree)((ppVar11->host).rawalloc);
    (ppVar11->host).rawalloc = (char *)0x0;
    pcVar7 = (*Curl_cstrdup)((char *)__s_00);
    (ppVar11->host).rawalloc = pcVar7;
    (ppVar11->host).name = pcVar7;
    bVar13 = pcVar7 != (char *)0x0;
    CVar12 = CURLE_OUT_OF_MEMORY;
    if (bVar13) {
      CVar12 = CVar5;
    }
  }
  else {
    local_48 = ppVar10;
    local_40 = uVar8;
    (*Curl_cfree)(ppVar11->user);
    ppVar11->user = (char *)0x0;
    pcVar7 = curl_easy_unescape(local_50,local_68,0,(int *)0x0);
    ppVar11->user = pcVar7;
    (*Curl_cfree)(local_68);
    local_68 = (char *)0x0;
    if (ppVar11->user == (char *)0x0) {
      (*Curl_cfree)(local_70);
    }
    else {
      (*Curl_cfree)(ppVar11->passwd);
      pcVar7 = local_70;
      ppVar11->passwd = (char *)0x0;
      if ((local_70 == (char *)0x0) || (sVar9 = strlen(local_70), 0xff < sVar9)) {
        pcVar7 = (*Curl_cstrdup)("");
      }
      else {
        pcVar7 = curl_easy_unescape(local_50,pcVar7,0,(int *)0x0);
      }
      ppVar11->passwd = pcVar7;
      (*Curl_cfree)(local_70);
      local_70 = (char *)0x0;
      if (ppVar11->passwd != (char *)0x0) {
        (local_60->bits).proxy_user_passwd = true;
        uVar8 = local_40;
        ppVar10 = local_48;
        goto LAB_00444d2f;
      }
    }
    local_70 = (char *)0x0;
    bVar13 = false;
    CVar12 = CURLE_OUT_OF_MEMORY;
  }
  if (!bVar13) {
    return CVar12;
  }
LAB_00444db3:
  (*Curl_cfree)(local_68);
  local_68 = (char *)0x0;
  (*Curl_cfree)(local_70);
  return CURLE_OK;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  bool sockstype;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot + 3;
    if(checkprefix("https", proxy))
      proxytype = CURLPROXY_HTTPS;
    else if(checkprefix("socks5h", proxy))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      proxytype = CURLPROXY_SOCKS4;
    else if(checkprefix("http:", proxy))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      return CURLE_COULDNT_CONNECT;
    }
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

#ifdef USE_SSL
  if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
#endif
    if(proxytype == CURLPROXY_HTTPS) {
      failf(data, "Unsupported proxy \'%s\', libcurl is built without the "
                  "HTTPS-proxy support.", proxy);
      return CURLE_NOT_BUILT_IN;
    }

  sockstype = proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
              proxytype == CURLPROXY_SOCKS5 ||
              proxytype == CURLPROXY_SOCKS4A ||
              proxytype == CURLPROXY_SOCKS4;

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    CURLcode result =
      Curl_parse_login_details(proxyptr, atsign - proxyptr,
                               &proxyuser, &proxypasswd, NULL);
    if(result)
      return result;
    proxyptr = atsign + 1;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unreserved characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    char *endp = NULL;

    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    port = strtol(prox_portno, &endp, 10);
    if((endp && *endp && (*endp != '/') && (*endp != ' ')) ||
       (port < 0) || (port > 65535)) {
      /* meant to detect for example invalid IPv6 numerical addresses without
         brackets: "2a00:fac0:a000::7:13". Accept a trailing slash only
         because we then allow "URL style" with the number followed by a
         slash, used in curl test cases already. Space is also an acceptable
         terminating symbol. */
      infof(data, "No valid port number in proxy string (%s)\n",
            prox_portno);
    }
    else
      conn->port = port;
  }
  else {
    if(proxyptr[0]=='/') {
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      Curl_safefree(proxyuser);
      Curl_safefree(proxypasswd);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = '\0'; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }

  if(*proxyptr) {
    struct proxy_info *proxyinfo =
      sockstype ? &conn->socks_proxy : &conn->http_proxy;
    proxyinfo->proxytype = proxytype;

    if(proxyuser) {
      /* found user and password, rip them out.  note that we are unescaping
         them, as there is otherwise no way to have a username or password
         with reserved characters like ':' in them. */
      Curl_safefree(proxyinfo->user);
      proxyinfo->user = curl_easy_unescape(data, proxyuser, 0, NULL);
      Curl_safefree(proxyuser);

      if(!proxyinfo->user) {
        Curl_safefree(proxypasswd);
        return CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(proxyinfo->passwd);
      if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
        proxyinfo->passwd = curl_easy_unescape(data, proxypasswd, 0, NULL);
      else
        proxyinfo->passwd = strdup("");
      Curl_safefree(proxypasswd);

      if(!proxyinfo->passwd)
        return CURLE_OUT_OF_MEMORY;

      conn->bits.proxy_user_passwd = TRUE; /* enable it */
    }

    if(port >= 0) {
      proxyinfo->port = port;
      if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
        conn->port = port;
    }

    /* now, clone the cleaned proxy host name */
    Curl_safefree(proxyinfo->host.rawalloc);
    proxyinfo->host.rawalloc = strdup(proxyptr);
    proxyinfo->host.name = proxyinfo->host.rawalloc;

    if(!proxyinfo->host.rawalloc)
      return CURLE_OUT_OF_MEMORY;
  }

  Curl_safefree(proxyuser);
  Curl_safefree(proxypasswd);

  return CURLE_OK;
}